

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O2

void __thiscall
dgMeshEffect::GetMaterialGetIndexStream
          (dgMeshEffect *this,dgIndexArray *handle,HaI32 materialHandle,HaI32 *indexArray)

{
  int iVar1;
  HaI32 *pHVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  iVar1 = handle->m_materials[materialHandle];
  lVar4 = 0xc;
  iVar5 = 0;
  for (lVar3 = 0; lVar3 < handle->m_indexCount; lVar3 = lVar3 + 1) {
    pHVar2 = handle->m_indexList;
    if (*(int *)((long)pHVar2 + lVar4) == iVar1) {
      indexArray[iVar5] = *(HaI32 *)((long)pHVar2 + lVar4 + -0xc);
      indexArray[(long)iVar5 + 1] = *(HaI32 *)((long)pHVar2 + lVar4 + -8);
      indexArray[(long)iVar5 + 2] = *(HaI32 *)((long)pHVar2 + lVar4 + -4);
      iVar5 = iVar5 + 3;
    }
    lVar4 = lVar4 + 0x10;
  }
  return;
}

Assistant:

void dgMeshEffect::GetMaterialGetIndexStream (dgIndexArray* const handle, hacd::HaI32 materialHandle, hacd::HaI32* const indexArray)
{
	hacd::HaI32 index;
	hacd::HaI32 textureID;

	index = 0;
	textureID = handle->m_materials[materialHandle];
	for (hacd::HaI32 j = 0; j < handle->m_indexCount; j ++) {
		if (handle->m_indexList[j * 4 + 3] == textureID) {
			indexArray[index + 0] = handle->m_indexList[j * 4 + 0];
			indexArray[index + 1] = handle->m_indexList[j * 4 + 1];
			indexArray[index + 2] = handle->m_indexList[j * 4 + 2];

			index += 3;
		}
	}
}